

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndirectObjectsReferenceRegistry.cpp
# Opt level: O0

EStatusCode __thiscall
IndirectObjectsReferenceRegistry::ReadState
          (IndirectObjectsReferenceRegistry *this,PDFParser *inStateReader,ObjectIDType inObjectID)

{
  PDFArray **this_00;
  bool bVar1;
  PDFObject *pPVar2;
  PDFDictionary *pPVar3;
  PDFArray *this_01;
  value_type pPVar4;
  PDFBoolean *pPVar5;
  PDFInteger *pPVar6;
  longlong lVar7;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  PDFObjectCastPtr<PDFInteger> generationNumber;
  string local_198;
  undefined1 local_178 [8];
  PDFObjectCastPtr<PDFBoolean> objectDirty;
  string local_160;
  undefined1 local_140 [8];
  PDFObjectCastPtr<PDFInteger> objectReferenceType;
  string local_128;
  undefined1 local_108 [8];
  PDFObjectCastPtr<PDFInteger> writePosition;
  string local_f0;
  undefined1 local_d0 [8];
  PDFObjectCastPtr<PDFBoolean> objectWritten;
  PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary;
  ObjectWriteInformation newObjectInformation;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  string local_70;
  undefined1 local_40 [8];
  PDFObjectCastPtr<PDFArray> objectsWritesRegistry;
  PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary;
  ObjectIDType inObjectID_local;
  PDFParser *inStateReader_local;
  IndirectObjectsReferenceRegistry *this_local;
  
  pPVar2 = PDFParser::ParseNewObject(inStateReader,inObjectID);
  this_00 = &objectsWritesRegistry.super_RefCountPtr<PDFArray>.mValue;
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)this_00,pPVar2);
  pPVar3 = RefCountPtr<PDFDictionary>::operator->((RefCountPtr<PDFDictionary> *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"mObjectsWritesRegistry",
             (allocator<char> *)
             ((long)&it.
                     super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                     .mCurrentPosition._M_current + 7));
  pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_70);
  PDFObjectCastPtr<PDFArray>::PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_40,pPVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&it.
                     super_ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                     .mCurrentPosition._M_current + 7));
  this_01 = RefCountPtr<PDFArray>::operator->((RefCountPtr<PDFArray> *)local_40);
  PDFArray::GetIterator
            ((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
              *)&newObjectInformation.mGenerationNumber,this_01);
  std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::clear
            (&this->mObjectsWritesRegistry);
  while( true ) {
    bVar1 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::MoveNext
                      ((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> *
                       )&newObjectInformation.mGenerationNumber);
    if (!bVar1) break;
    pPVar4 = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::
             GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                      *)&newObjectInformation.mGenerationNumber);
    pPVar2 = PDFParser::ParseNewObject
                       (inStateReader,
                        (ObjectIDType)pPVar4[1].super_RefCountObject._vptr_RefCountObject);
    PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFDictionary> *)
               &objectWritten.super_RefCountPtr<PDFBoolean>.mValue,pPVar2);
    pPVar3 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"mObjectWritten",
               (allocator<char> *)((long)&writePosition.super_RefCountPtr<PDFInteger>.mValue + 7));
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_f0);
    PDFObjectCastPtr<PDFBoolean>::PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_d0,pPVar2);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&writePosition.super_RefCountPtr<PDFInteger>.mValue + 7));
    pPVar5 = RefCountPtr<PDFBoolean>::operator->((RefCountPtr<PDFBoolean> *)local_d0);
    objectWriteInformationDictionary.super_RefCountPtr<PDFDictionary>.mValue._0_1_ =
         PDFBoolean::GetValue(pPVar5);
    if ((bool)objectWriteInformationDictionary.super_RefCountPtr<PDFDictionary>.mValue._0_1_) {
      pPVar3 = RefCountPtr<PDFDictionary>::operator->
                         ((RefCountPtr<PDFDictionary> *)
                          &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"mWritePosition",
                 (allocator<char> *)
                 ((long)&objectReferenceType.super_RefCountPtr<PDFInteger>.mValue + 7));
      pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_128);
      PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr
                ((PDFObjectCastPtr<PDFInteger> *)local_108,pPVar2);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&objectReferenceType.super_RefCountPtr<PDFInteger>.mValue + 7));
      pPVar6 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_108);
      newObjectInformation._0_8_ = PDFInteger::GetValue(pPVar6);
      PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_108);
    }
    pPVar3 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"mObjectReferenceType",
               (allocator<char> *)((long)&objectDirty.super_RefCountPtr<PDFBoolean>.mValue + 7));
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_160);
    PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_140,pPVar2)
    ;
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&objectDirty.super_RefCountPtr<PDFBoolean>.mValue + 7));
    pPVar6 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_140);
    lVar7 = PDFInteger::GetValue(pPVar6);
    newObjectInformation.mWritePosition._0_4_ = (undefined4)lVar7;
    pPVar3 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"mIsDirty",
               (allocator<char> *)((long)&generationNumber.super_RefCountPtr<PDFInteger>.mValue + 7)
              );
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_198);
    PDFObjectCastPtr<PDFBoolean>::PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_178,pPVar2)
    ;
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&generationNumber.super_RefCountPtr<PDFInteger>.mValue + 7)
              );
    pPVar5 = RefCountPtr<PDFBoolean>::operator->((RefCountPtr<PDFBoolean> *)local_178);
    objectWriteInformationDictionary.super_RefCountPtr<PDFDictionary>.mValue._1_1_ =
         PDFBoolean::GetValue(pPVar5);
    pPVar3 = RefCountPtr<PDFDictionary>::operator->
                       ((RefCountPtr<PDFDictionary> *)
                        &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"mGenerationNumber",&local_1d1);
    pPVar2 = PDFDictionary::QueryDirectObject(pPVar3,&local_1d0);
    PDFObjectCastPtr<PDFInteger>::PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_1b0,pPVar2)
    ;
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    pPVar6 = RefCountPtr<PDFInteger>::operator->((RefCountPtr<PDFInteger> *)local_1b0);
    newObjectInformation._16_8_ = PDFInteger::GetValue(pPVar6);
    std::vector<ObjectWriteInformation,_std::allocator<ObjectWriteInformation>_>::push_back
              (&this->mObjectsWritesRegistry,
               (value_type *)
               &objectWriteInformationDictionary.super_RefCountPtr<PDFDictionary>.mValue);
    PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_1b0);
    PDFObjectCastPtr<PDFBoolean>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_178);
    PDFObjectCastPtr<PDFInteger>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFInteger> *)local_140);
    PDFObjectCastPtr<PDFBoolean>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFBoolean> *)local_d0);
    PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
              ((PDFObjectCastPtr<PDFDictionary> *)
               &objectWritten.super_RefCountPtr<PDFBoolean>.mValue);
  }
  PDFObjectCastPtr<PDFArray>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFArray> *)local_40);
  PDFObjectCastPtr<PDFDictionary>::~PDFObjectCastPtr
            ((PDFObjectCastPtr<PDFDictionary> *)
             &objectsWritesRegistry.super_RefCountPtr<PDFArray>.mValue);
  return eSuccess;
}

Assistant:

EStatusCode IndirectObjectsReferenceRegistry::ReadState(PDFParser* inStateReader,ObjectIDType inObjectID)
{
	PDFObjectCastPtr<PDFDictionary> indirectObjectsDictionary(inStateReader->ParseNewObject(inObjectID));

	PDFObjectCastPtr<PDFArray> objectsWritesRegistry(indirectObjectsDictionary->QueryDirectObject("mObjectsWritesRegistry"));

	SingleValueContainerIterator<PDFObjectVector> it = objectsWritesRegistry->GetIterator();

	mObjectsWritesRegistry.clear();
	while(it.MoveNext())
	{
		ObjectWriteInformation newObjectInformation;
		PDFObjectCastPtr<PDFDictionary> objectWriteInformationDictionary(inStateReader->ParseNewObject(
																				((PDFIndirectObjectReference*)it.GetItem())->mObjectID));
		
		PDFObjectCastPtr<PDFBoolean> objectWritten(objectWriteInformationDictionary->QueryDirectObject("mObjectWritten"));

		newObjectInformation.mObjectWritten = objectWritten->GetValue();

		if(newObjectInformation.mObjectWritten)
		{
			PDFObjectCastPtr<PDFInteger> writePosition(objectWriteInformationDictionary->QueryDirectObject("mWritePosition"));
			newObjectInformation.mWritePosition = writePosition->GetValue();
		}

		PDFObjectCastPtr<PDFInteger> objectReferenceType(objectWriteInformationDictionary->QueryDirectObject("mObjectReferenceType"));
		newObjectInformation.mObjectReferenceType = (ObjectWriteInformation::EObjectReferenceType)objectReferenceType->GetValue();

		PDFObjectCastPtr<PDFBoolean> objectDirty(objectWriteInformationDictionary->QueryDirectObject("mIsDirty"));
        newObjectInformation.mIsDirty = objectDirty->GetValue();
        
        PDFObjectCastPtr<PDFInteger> generationNumber(objectWriteInformationDictionary->QueryDirectObject("mGenerationNumber"));
        newObjectInformation.mGenerationNumber = (unsigned long)generationNumber->GetValue();

		mObjectsWritesRegistry.push_back(newObjectInformation);
	}

	return PDFHummus::eSuccess;
}